

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

randomx_flags randomx_get_flags(void)

{
  bool bVar1;
  randomx_argon2_impl *prVar2;
  Cpu cpu;
  randomx_flags flags;
  randomx_flags *unaff_retaddr;
  Cpu *in_stack_00000010;
  Cpu local_7;
  randomx_flags b;
  
  b = RANDOMX_FLAG_JIT;
  randomx::Cpu::Cpu(in_stack_00000010);
  bVar1 = randomx::Cpu::hasAes(&local_7);
  if (bVar1) {
    operator|=(unaff_retaddr,b);
  }
  prVar2 = randomx_argon2_impl_avx2();
  if ((prVar2 != (randomx_argon2_impl *)0x0) && (bVar1 = randomx::Cpu::hasAvx2(&local_7), bVar1)) {
    operator|=(unaff_retaddr,b);
  }
  prVar2 = randomx_argon2_impl_ssse3();
  if ((prVar2 != (randomx_argon2_impl *)0x0) && (bVar1 = randomx::Cpu::hasSsse3(&local_7), bVar1)) {
    operator|=(unaff_retaddr,b);
  }
  return b;
}

Assistant:

randomx_flags randomx_get_flags() {
		randomx_flags flags = RANDOMX_HAVE_COMPILER ? RANDOMX_FLAG_JIT : RANDOMX_FLAG_DEFAULT;
		randomx::Cpu cpu;
#ifdef RANDOMX_FORCE_SECURE
		if (flags == RANDOMX_FLAG_JIT) {
			flags |= RANDOMX_FLAG_SECURE;
		}
#endif
		if (HAVE_AES && cpu.hasAes()) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (randomx_argon2_impl_avx2() != nullptr && cpu.hasAvx2()) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (randomx_argon2_impl_ssse3() != nullptr && cpu.hasSsse3()) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		return flags;
	}